

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool Internal_UnclampedKnots(int order,int cv_count,double *cv,double *knot)

{
  bool bVar1;
  double dVar2;
  
  if ((((order < 3) || ((knot == (double *)0x0 || cv == (double *)0x0) || cv_count < order)) ||
      (*knot <= -1.23432101234321e+308)) ||
     (((1.23432101234321e+308 <= knot[(ulong)(uint)(cv_count + order) - 3] ||
       (knot[(ulong)(uint)order - 1] + -2.3283064365386963e-10 <= knot[(ulong)(uint)order - 2])) ||
      (dVar2 = knot[(ulong)(uint)cv_count - 1] + -2.3283064365386963e-10,
      dVar2 < knot[(ulong)(uint)cv_count - 2] || dVar2 == knot[(ulong)(uint)cv_count - 2])))) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (knot[(ulong)(uint)order - 2] + -2.3283064365386963e-10 <= *knot) {
      return knot[(ulong)(uint)cv_count - 1] <
             knot[(ulong)(uint)(cv_count + order) - 3] + -2.3283064365386963e-10;
    }
  }
  return bVar1;
}

Assistant:

static bool Internal_UnclampedKnots(
  int order,
  int cv_count,
  const double* cv,
  const double* knot
  )
{
  return
    order >= 3
    && cv_count >= order
    && nullptr != cv
    && nullptr != knot
    && knot[0] > ON_UNSET_VALUE
    && knot[cv_count + order - 3] < ON_UNSET_POSITIVE_VALUE
    && knot[order - 2] < knot[order - 1] - ON_ZERO_TOLERANCE
    && knot[cv_count - 2] < knot[cv_count - 1] - ON_ZERO_TOLERANCE
    && ((knot[0] < knot[order - 2] - ON_ZERO_TOLERANCE) || (knot[cv_count - 1] < knot[cv_count + order - 3] - ON_ZERO_TOLERANCE))
    ;
}